

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vx-sound.c
# Opt level: O0

void ALnssSleep(unsigned_long nsec)

{
  int iVar1;
  int *piVar2;
  ulong in_RDI;
  bool bVar3;
  timespec rem;
  timespec ts;
  timespec local_28;
  timespec local_18;
  
  local_18.tv_sec = in_RDI / 1000000000;
  local_18.tv_nsec = in_RDI % 1000000000;
  while( true ) {
    iVar1 = nanosleep(&local_18,&local_28);
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
    if (!bVar3) break;
    local_18.tv_sec = local_28.tv_sec;
    local_18.tv_nsec = local_28.tv_nsec;
  }
  return;
}

Assistant:

void ALnssSleep(unsigned long nsec) {
    struct timespec ts, rem;
    ts.tv_sec = (time_t) (nsec / 1000000000ul);
    ts.tv_nsec = (long) (nsec % 1000000000ul);
    while (nanosleep(&ts, &rem) == -1 && errno == EINTR)
        ts = rem;
}